

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

u32 sqlite3IsTrueOrFalse(char *zIn)

{
  int iVar1;
  char *in_RDI;
  u32 local_4;
  
  iVar1 = sqlite3StrICmp(in_RDI,"true");
  if (iVar1 == 0) {
    local_4 = 0x10000000;
  }
  else {
    iVar1 = sqlite3StrICmp(in_RDI,"false");
    if (iVar1 == 0) {
      local_4 = 0x20000000;
    }
    else {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

SQLITE_PRIVATE u32 sqlite3IsTrueOrFalse(const char *zIn){
  if( sqlite3StrICmp(zIn, "true")==0  ) return EP_IsTrue;
  if( sqlite3StrICmp(zIn, "false")==0 ) return EP_IsFalse;
  return 0;
}